

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

int match_list(int *acc,char **str,size_t *len,char *lst,size_t lstlen,date_parse_string *capture)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  byte *pbVar5;
  size_t sVar6;
  byte *pbVar7;
  int iVar8;
  int idx;
  char *curstr;
  size_t curlen;
  date_parse_string part;
  int local_84;
  char *local_68;
  int *local_60;
  date_parse_string *local_58;
  size_t local_50;
  date_parse_string local_48;
  
  if (lstlen == 0) {
    return 0;
  }
  while ((-1 < *lst && (iVar3 = isspace((int)*lst), iVar3 != 0))) {
    lst = (char *)((byte *)lst + 1);
    lstlen = lstlen - 1;
    if (lstlen == 0) {
      return 0;
    }
  }
  iVar3 = 0;
  local_84 = 1;
  iVar8 = 0;
  local_60 = acc;
  local_58 = capture;
  do {
    pbVar7 = (byte *)lst + lstlen;
    pbVar5 = (byte *)lst;
    do {
      if (((ulong)*pbVar5 < 0x3e) && ((0x2800100000000000U >> ((ulong)*pbVar5 & 0x3f) & 1) != 0)) {
        bVar2 = false;
        goto LAB_00286216;
      }
      pbVar5 = pbVar5 + 1;
      lstlen = lstlen - 1;
    } while (lstlen != 0);
    bVar2 = true;
    lstlen = 0;
    pbVar5 = pbVar7;
LAB_00286216:
    local_68 = *str;
    local_50 = *len;
    local_48.p = (char *)0x0;
    local_48.len = 0;
    if ((((long)pbVar5 - (long)lst != 0) &&
        (iVar4 = match_lit(&local_68,&local_50,lst,(long)pbVar5 - (long)lst,&local_48), iVar4 != 0))
       && ((long)iVar8 < (long)local_68 - (long)*str)) {
      iVar8 = (int)((long)local_68 - (long)*str);
      iVar3 = local_84;
    }
    if (bVar2) break;
    bVar1 = *pbVar5;
    if (bVar1 == 0x2c) {
      local_84 = local_84 + 1;
      do {
        lstlen = lstlen - 1;
        pbVar5 = pbVar5 + 1;
        if (lstlen == 0) goto LAB_002862de;
      } while ((-1 < (char)*pbVar5) && (iVar4 = isspace((int)(char)*pbVar5), iVar4 != 0));
    }
    else if (bVar1 == 0x3d) {
      pbVar5 = pbVar5 + 1;
      lstlen = lstlen - 1;
    }
    else if (bVar1 == 0x3b) break;
    lst = (char *)pbVar5;
  } while (lstlen != 0);
LAB_002862de:
  if (iVar8 != 0) {
    local_58->p = *str;
    sVar6 = (size_t)iVar8;
    local_58->len = sVar6;
    *local_60 = iVar3;
    *str = *str + sVar6;
    *len = *len - sVar6;
  }
  return (uint)(iVar8 != 0);
}

Assistant:

static int match_list(int &acc, const char *&str, size_t &len,
                      const char *lst, size_t lstlen,
                      date_parse_string &capture)
{
    /* no matches yet */
    int bestlen = 0;
    int bestidx = 0;

    /* skip leading spaces */
    for ( ; lstlen != 0 && is_space(*lst) ; ++lst, --lstlen) ;
    
    /* keep going until we're out of list */
    for (int idx = 1 ; lstlen != 0 ; )
    {
        /* find the next delimiter */
        const char *p = lst;
        size_t rem = lstlen;
        for ( ; rem != 0 && *p != '=' && *p != ',' && *p != ';' ; ++p, --rem) ;

        /* try matching this text */
        const char *curstr = str;
        size_t curlen = len;
        date_parse_string part;
        if (p - lst != 0 && match_lit(curstr, curlen, lst, p - lst, part))
        {
            /* if this is the best one so far, remember it */
            if (curstr - str > bestlen)
            {
                bestlen = curstr - str;
                bestidx = idx;
            }
        }

        /* 
         *   If we're at an '=', an alias for this same item follows, so keep
         *   going without upping the index.  If we're at a comma, we're on
         *   to the next item.  If we're at a ';' or the end of the string,
         *   it's the end of the list, so we've failed to find a match.
         */
        if (rem == 0 || *p == ';')
        {
            /* end of the list */
            break;
        }
        else if (*p == ',')
        {
            /* next list item follows - up the index */
            ++idx;

            /* skip the comma and any spaces before the next item */
            for (++p, --rem ; rem != 0 && is_space(*p) ; ++p, --rem) ;
        }
        else if (*p == '=')
        {
            /* alias - just skip the '=' */
            ++p, --rem;
        }

        /* on to the next item */
        lst = p;
        lstlen = rem;
    }

    /* if we found a match, return it */
    if (bestlen != 0)
    {
        capture.p = str;
        capture.len = bestlen;
        acc = bestidx;
        str += bestlen;
        len -= bestlen;
        return TRUE;
    }
    else
        return FALSE;
}